

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O2

gguf_context * gguf_init_empty(void)

{
  gguf_context *pgVar1;
  
  pgVar1 = (gguf_context *)operator_new(0x58);
  pgVar1->version = 3;
  (pgVar1->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (pgVar1->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (pgVar1->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (pgVar1->info).super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pgVar1->info).super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pgVar1->info).super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pgVar1->alignment = 0x20;
  pgVar1->offset = 0;
  pgVar1->size = 0;
  pgVar1->data = (void *)0x0;
  return pgVar1;
}

Assistant:

struct gguf_context * gguf_init_empty(void) {
    return new gguf_context;
}